

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::clear(SessionState *this)

{
  if (this->m_pLog != (Log *)0x0) {
    Mutex::lock(&this->m_mutex);
    (*this->m_pLog->_vptr_Log[2])();
    Mutex::unlock(&this->m_mutex);
    return;
  }
  return;
}

Assistant:

void clear() {
    if (!m_pLog) {
      return;
    }
    Locker l(m_mutex);
    m_pLog->clear();
  }